

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O0

string * __thiscall
Diligent::FormatString<char[23],char_const*,char[20],unsigned_int,char[5],unsigned_long,char[143]>
          (string *__return_storage_ptr__,Diligent *this,char (*Args) [23],char **Args_1,
          char (*Args_2) [20],uint *Args_3,char (*Args_4) [5],unsigned_long *Args_5,
          char (*Args_6) [143])

{
  stringstream local_1c0 [8];
  stringstream ss;
  char (*Args_local_4) [5];
  uint *Args_local_3;
  char (*Args_local_2) [20];
  char **Args_local_1;
  char (*Args_local) [23];
  
  std::__cxx11::stringstream::stringstream(local_1c0);
  FormatStrSS<std::__cxx11::stringstream,char[23],char_const*,char[20],unsigned_int,char[5],unsigned_long,char[143]>
            ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0,
             (char (*) [23])this,(char **)Args,(char (*) [20])Args_1,(uint *)Args_2,
             (char (*) [5])Args_3,(unsigned_long *)Args_4,(char (*) [143])Args_5);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1c0);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatString(const RestArgsType&... Args)
{
    std::stringstream ss;
    FormatStrSS(ss, Args...);
    return ss.str();
}